

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_reduce.hpp
# Opt level: O3

BBox<2> * __thiscall
Omega_h::
transform_reduce<Omega_h::IntIterator,Omega_h::GetBBoxOp<2>,Omega_h::BBox<2>,Omega_h::UniteOp<2>>
          (BBox<2> *__return_storage_ptr__,int param_2,int first,ulong *param_4,undefined8 param_5,
          undefined8 param_6,double init,double param_8,double param_9,double param_10)

{
  int *piVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  bool bVar5;
  double *pdVar6;
  long lVar7;
  int iVar8;
  double *pdVar9;
  double *pdVar10;
  int iVar11;
  bool bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  BBox<2> c;
  Alloc *local_a8;
  double local_98;
  double dStack_90;
  double local_88 [4];
  double local_68 [4];
  double dStack_48;
  double local_40 [2];
  
  local_a8 = (Alloc *)*param_4;
  uVar4 = param_4[1];
  if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
    local_a8->use_count = local_a8->use_count + -1;
    local_a8 = (Alloc *)(local_a8->size * 8 + 1);
  }
  *param_4 = 0;
  param_4[1] = 0;
  entering_parallel = 0;
  if (param_2 != first) {
    iVar11 = 0;
    iVar8 = param_2;
    do {
      local_88[0] = param_9;
      local_88[1] = param_10;
      local_98 = init;
      dStack_90 = param_8;
      pdVar6 = (double *)(uVar4 + (long)((iVar11 + param_2) * 2) * 8);
      local_88[2] = *pdVar6;
      local_88[3] = pdVar6[1];
      local_68[0] = local_88[2];
      local_68[1] = local_88[3];
      lVar7 = 0;
      pdVar6 = local_68 + 3;
      pdVar9 = &local_98;
      pdVar10 = local_88 + 2;
      bVar5 = true;
      do {
        bVar12 = bVar5;
        dVar2 = *pdVar10;
        uVar13 = SUB84(dVar2,0);
        uVar14 = (undefined4)((ulong)dVar2 >> 0x20);
        dVar3 = *pdVar9;
        if (dVar3 <= dVar2) {
          uVar13 = SUB84(dVar3,0);
          uVar14 = (undefined4)((ulong)dVar3 >> 0x20);
        }
        dVar2 = local_68[lVar7];
        uVar15 = SUB84(dVar2,0);
        uVar16 = (undefined4)((ulong)dVar2 >> 0x20);
        dVar3 = local_88[lVar7];
        if (dVar2 <= dVar3) {
          uVar15 = SUB84(dVar3,0);
          uVar16 = (undefined4)((ulong)dVar3 >> 0x20);
        }
        *pdVar6 = (double)CONCAT44(uVar14,uVar13);
        local_40[lVar7] = (double)CONCAT44(uVar16,uVar15);
        lVar7 = 1;
        pdVar6 = &dStack_48;
        pdVar9 = &dStack_90;
        pdVar10 = local_88 + 3;
        bVar5 = false;
      } while (bVar12);
      init = local_68[3];
      param_8 = dStack_48;
      param_9 = local_40[0];
      param_10 = local_40[1];
      iVar8 = iVar8 + 1;
      iVar11 = iVar11 + 1;
    } while (iVar8 != first);
  }
  (__return_storage_ptr__->max).super_Few<double,_2>.array_[0] = param_9;
  (__return_storage_ptr__->max).super_Few<double,_2>.array_[1] = param_10;
  (__return_storage_ptr__->min).super_Few<double,_2>.array_[0] = init;
  (__return_storage_ptr__->min).super_Few<double,_2>.array_[1] = param_8;
  if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
    piVar1 = &local_a8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a8);
      operator_delete(local_a8,0x48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result transform_reduce(
    Iterator first, Iterator last, Result init, Op op, Tranform&& transform) {
  Omega_h::entering_parallel = true;
  auto const transform_local = std::move(transform);
  Omega_h::entering_parallel = false;
  for (; first != last; ++first) {
    init = op(std::move(init), transform_local(*first));
  }
  return init;
}